

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void __thiscall LiteScript::State::UseNamespace(State *this,char *name)

{
  Namespace *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Object *pOVar4;
  Type *this_01;
  ulong uVar5;
  string nsp;
  Nullable<LiteScript::Variable> local_88;
  char *local_68;
  undefined8 local_60;
  char local_58 [16];
  char *local_48;
  
  local_48 = name;
  std::__cxx11::string::string((string *)&local_68,name,(allocator *)&local_88);
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar2 == 0) {
    Namer::Use((this->nsp_lifo).
               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
               super__Vector_impl_data._M_finish + -1,&this->nsp_global);
  }
  else {
    local_88.isNull = &local_88.is_null;
    local_88.is_null = false;
    Variable::Variable((Variable *)&local_88,&this->nsp_global);
    iVar2 = (int)local_60;
    local_60 = 0;
    *local_68 = '\0';
    if (iVar2 + 1U != 0) {
      uVar5 = 0;
      do {
        if ((local_48[uVar5] == '.') || (local_48[uVar5] == '\0')) {
          pOVar4 = Variable::operator->((Variable *)&local_88);
          this_00 = (Namespace *)pOVar4->data;
          iVar3 = Namespace::IndexOf(this_00,local_68);
          if (iVar3 < 0) {
            Memory::Create((Memory *)&stack0xffffffffffffffc0,(Type *)this->memory);
            Nullable<LiteScript::Variable>::operator=
                      (&local_88,(Variable *)&stack0xffffffffffffffc0);
            Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
            Namespace::DefineVariable(this_00,local_68,(Variable *)&local_88);
          }
          else {
            Namespace::GetVariable((Namespace *)&stack0xffffffffffffffc0,(uint)this_00);
            Nullable<LiteScript::Variable>::operator=
                      (&local_88,(Variable *)&stack0xffffffffffffffc0);
            Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
            pOVar4 = Variable::operator->((Variable *)&local_88);
            this_01 = Object::GetType(pOVar4);
            bVar1 = Type::operator!=(this_01,(Type *)_type_namespace);
            if (bVar1) {
              UseNamespace(this,"global");
              goto LAB_0012e3e7;
            }
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_68);
        }
        uVar5 = uVar5 + 1;
      } while (iVar2 + 1U != uVar5);
    }
    Namer::Use((this->nsp_lifo).
               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
               super__Vector_impl_data._M_finish + -1,(Variable *)&local_88);
LAB_0012e3e7:
    if (local_88.is_null == false) {
      Variable::~Variable((Variable *)&local_88);
    }
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void LiteScript::State::UseNamespace(const char *name) {
    std::string nsp(name);
    if (nsp == "global") {
        this->nsp_lifo.back().Use(this->nsp_global);
        return;
    }
    Nullable<Variable> v(this->nsp_global);
    unsigned len = nsp.size() + 1;
    nsp.clear();
    for (unsigned int i = 0; i < len; i++) {
        if (name[i] == '.' || name[i] == '\0') {
            Namespace& tmp = (*v)->GetData<Namespace>();
            int index = tmp.IndexOf(nsp.c_str());
            if (index < 0) {
                v = this->memory.Create(Type::NAMESPACE);
                tmp.DefineVariable(nsp.c_str(), *v);
            }
            else {
                v = tmp.GetVariable((unsigned int)index);
                if ((*v)->GetType() != Type::NAMESPACE) {
                    this->UseNamespace();
                    return;
                }
            }
        }
        else {
            nsp += name[i];
        }
    }
    this->nsp_lifo.back().Use(*v);
}